

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phone_loop_search.c
# Opt level: O0

int phone_loop_search_start(ps_search_t *search)

{
  hmm_t *h;
  hmm_t *hmm;
  int i;
  phone_loop_search_t *pls;
  ps_search_t *search_local;
  
  for (hmm._4_4_ = 0; hmm._4_4_ < *(short *)((long)&search[1].name + 2); hmm._4_4_ = hmm._4_4_ + 1)
  {
    h = (hmm_t *)((long)search[1].vt + (long)hmm._4_4_ * 0x58);
    hmm_clear(h);
    hmm_enter(h,0,-1,0);
  }
  memset(search[1].acmod,0,(long)*(short *)((long)&search[1].name + 2) << 2);
  for (hmm._4_4_ = 0; hmm._4_4_ < *(int *)&search[1].dag; hmm._4_4_ = hmm._4_4_ + 1) {
    memset((&(search[1].pls)->vt)[hmm._4_4_],0,(long)*(short *)((long)&search[1].name + 2) << 2);
  }
  phone_loop_search_free_renorm((phone_loop_search_t *)search);
  *(undefined4 *)&search[1].d2p = 0;
  *(undefined2 *)&search[1].config = 0;
  return 0;
}

Assistant:

static int
phone_loop_search_start(ps_search_t *search)
{
    phone_loop_search_t *pls = (phone_loop_search_t *)search;
    int i;

    /* Reset and enter all phone HMMs. */
    for (i = 0; i < pls->n_phones; ++i) {
        hmm_t *hmm = (hmm_t *)&pls->hmms[i];
        hmm_clear(hmm);
        hmm_enter(hmm, 0, -1, 0);
    }
    memset(pls->penalties, 0, pls->n_phones * sizeof(*pls->penalties));
    for (i = 0; i < pls->window; i++)
        memset(pls->pen_buf[i], 0, pls->n_phones * sizeof(*pls->pen_buf[i]));
    phone_loop_search_free_renorm(pls);
    pls->best_score = 0;
    pls->pen_buf_ptr = 0;

    return 0;
}